

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_if.cc
# Opt level: O1

unique_ptr<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>_>
 __thiscall absl::time_internal::cctz::TimeZoneIf::Load(TimeZoneIf *this,string *name)

{
  bool bVar1;
  int iVar2;
  TimeZoneInfo *this_00;
  TimeZoneLibC *this_01;
  pointer __old_p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = std::__cxx11::string::compare((ulong)name,0,(char *)0x5);
  if (iVar2 == 0) {
    this_01 = (TimeZoneLibC *)operator_new(0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,name,5,0xffffffffffffffff);
    TimeZoneLibC::TimeZoneLibC(this_01,&local_38);
    this->_vptr_TimeZoneIf = (_func_int **)this_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (TimeZoneInfo *)operator_new(0xc0);
    (this_00->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)&PTR__TimeZoneInfo_0018aad0;
    (this_00->transitions_).
    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->transitions_).
    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->transitions_).
    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->transition_types_).
    super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->transition_types_).
    super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->transition_types_).
    super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->abbreviations_)._M_dataplus._M_p = (pointer)&(this_00->abbreviations_).field_2;
    (this_00->abbreviations_)._M_string_length = 0;
    (this_00->abbreviations_).field_2._M_local_buf[0] = '\0';
    (this_00->version_)._M_dataplus._M_p = (pointer)&(this_00->version_).field_2;
    (this_00->version_)._M_string_length = 0;
    (this_00->version_).field_2._M_local_buf[0] = '\0';
    (this_00->future_spec_)._M_dataplus._M_p = (pointer)&(this_00->future_spec_).field_2;
    (this_00->future_spec_)._M_string_length = 0;
    (this_00->future_spec_).field_2._M_local_buf[0] = '\0';
    (this_00->local_time_hint_).super___atomic_base<unsigned_long>._M_i = 0;
    (this_00->time_local_hint_).super___atomic_base<unsigned_long>._M_i = 0;
    bVar1 = TimeZoneInfo::Load(this_00,name);
    if (!bVar1) {
      (*(this_00->super_TimeZoneIf)._vptr_TimeZoneIf[1])(this_00);
      this_00 = (TimeZoneInfo *)0x0;
    }
    this->_vptr_TimeZoneIf = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
          )(__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneIf> TimeZoneIf::Load(const std::string& name) {
  // Support "libc:localtime" and "libc:*" to access the legacy
  // localtime and UTC support respectively from the C library.
  if (name.compare(0, 5, "libc:") == 0) {
    return std::unique_ptr<TimeZoneIf>(new TimeZoneLibC(name.substr(5)));
  }

  // Otherwise use the "zoneinfo" implementation by default.
  std::unique_ptr<TimeZoneInfo> tz(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();
  return std::unique_ptr<TimeZoneIf>(tz.release());
}